

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  bool bVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  char *str_00;
  size_t sVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  bVar1 = false;
  local_38.ptr_ = in_RAX;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38.ptr_ + 0x10),"The value of flag --",0x14);
    if (flag == (char *)0x0) {
      sVar2 = 6;
      flag = "(null)";
    }
    else {
      sVar2 = strlen(flag);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_38.ptr_ + 0x10),flag,sVar2)
    ;
    bVar1 = ParseInt32((Message *)&local_38,str_00,value);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38.ptr_ + 8))(local_38.ptr_);
    }
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}